

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t48(void)

{
  char cVar1;
  undefined8 uVar2;
  ALLEGRO_USTR_INFO i1;
  undefined1 auStack_18 [16];
  
  uVar2 = al_ref_cstr(auStack_18,anon_var_dwarf_134f);
  cVar1 = al_ustr_has_prefix_cstr(uVar2,"");
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_has_prefix_cstr(us1, \"\")");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_has_prefix_cstr(us1, \"\")");
  }
  cVar1 = al_ustr_has_prefix_cstr(uVar2,anon_var_dwarf_147b);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n",anon_var_dwarf_1487);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_1487);
  }
  cVar1 = al_ustr_has_prefix_cstr(uVar2,anon_var_dwarf_1493);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n",anon_var_dwarf_149f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_149f);
    error = error + 1;
  }
  cVar1 = al_ustr_has_suffix_cstr(uVar2,"");
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_has_suffix_cstr(us1, \"\")");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_has_suffix_cstr(us1, \"\")");
  }
  cVar1 = al_ustr_has_suffix_cstr(uVar2,anon_var_dwarf_134f + 10);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n",anon_var_dwarf_14c3);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_14c3);
  }
  cVar1 = al_ustr_has_suffix_cstr(uVar2,anon_var_dwarf_1493);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n",anon_var_dwarf_14cf);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_14cf);
    error = error + 1;
  }
  return;
}

Assistant:

static void t48(void)
{
   ALLEGRO_USTR_INFO i1;
   const ALLEGRO_USTR *us1 = al_ref_cstr(&i1, "Thú mỏ vịt");

   /* The _cstr versions are simple wrappers around the real functions so its
    * okay to test them only.
    */

   CHECK(al_ustr_has_prefix_cstr(us1, ""));
   CHECK(al_ustr_has_prefix_cstr(us1, "Thú"));
   CHECK(! al_ustr_has_prefix_cstr(us1, "Thú mỏ vịt."));

   CHECK(al_ustr_has_suffix_cstr(us1, ""));
   CHECK(al_ustr_has_suffix_cstr(us1, "vịt"));
   CHECK(! al_ustr_has_suffix_cstr(us1, "Thú mỏ vịt."));
}